

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O2

size_t asio::detail::
       buffer_size<__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>>
                 (long param_1,long param_2)

{
  size_t total_buffer_size;
  
  total_buffer_size = 0;
  for (; param_1 != param_2; param_1 = param_1 + 0x10) {
    total_buffer_size = total_buffer_size + *(long *)(param_1 + 8);
  }
  return total_buffer_size;
}

Assistant:

inline std::size_t buffer_size(multiple_buffers,
    Iterator begin, Iterator end) ASIO_NOEXCEPT
{
  std::size_t total_buffer_size = 0;

  Iterator iter = begin;
  for (; iter != end; ++iter)
  {
    const_buffer b(*iter);
    total_buffer_size += b.size();
  }

  return total_buffer_size;
}